

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c++
# Opt level: O1

void __thiscall kj::TlsContext::TlsContext(TlsContext *this,Options *options)

{
  Maybe<kj::Function<void_(kj::Exception_&&)>_> *pMVar1;
  TlsVersion TVar2;
  size_t sVar3;
  TlsCertificate *pTVar4;
  TlsKeypair *pTVar5;
  void *parg;
  TlsSniCallback *parg_00;
  Timer *pTVar6;
  Iface *pIVar7;
  Disposer *pDVar8;
  Maybe<kj::Function<void_(kj::Exception_&&)>_> *pMVar9;
  int iVar10;
  SSL_METHOD *meth;
  X509_STORE *ctx_00;
  long lVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  TlsSniCallback *sni;
  SSL_CTX *ctx;
  UnwindDetector _kjUnwindDetector775;
  SSL_CTX *local_68;
  Maybe<kj::Function<void_(kj::Exception_&&)>_> *local_60;
  Fault local_58;
  UnwindDetector local_4c;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_tls_c__:775:3)>
  local_48;
  
  (this->super_SecureNetworkWrapper)._vptr_SecureNetworkWrapper =
       (_func_int **)&PTR_wrapServer_0064cbd8;
  (this->timer).ptr = (Timer *)0x0;
  (this->acceptTimeout).ptr.isSet = false;
  (this->acceptErrorHandler).ptr.isSet = false;
  meth = (SSL_METHOD *)TLS_method();
  local_68 = SSL_CTX_new(meth);
  if (local_68 == (SSL_CTX *)0x0) {
    anon_unknown_312::throwOpensslError();
  }
  UnwindDetector::UnwindDetector(&local_4c);
  local_48.maybeFunc.ptr.isSet = true;
  local_48.maybeFunc.ptr.field_1.value.ctx = (SSL_CTX **)&local_68;
  local_48.maybeFunc.ptr.field_1.value._kjUnwindDetector775 = &local_4c;
  if (options->useSystemTrustStore == true) {
    iVar10 = SSL_CTX_set_default_verify_paths(local_68);
    if (iVar10 == 0) {
      anon_unknown_312::throwOpensslError();
    }
  }
  local_60 = &this->acceptErrorHandler;
  if ((options->trustedCertificates).size_ != 0) {
    ctx_00 = SSL_CTX_get_cert_store(local_68);
    if (ctx_00 == (X509_STORE *)0x0) {
      anon_unknown_312::throwOpensslError();
    }
    sVar3 = (options->trustedCertificates).size_;
    if (sVar3 != 0) {
      pTVar4 = (options->trustedCertificates).ptr;
      lVar14 = 0;
      do {
        iVar10 = X509_STORE_add_cert(ctx_00,*(X509 **)((long)pTVar4->chain + lVar14));
        if (iVar10 == 0) {
          anon_unknown_312::throwOpensslError();
        }
        lVar14 = lVar14 + 0x50;
      } while (sVar3 * 0x50 != lVar14);
    }
  }
  pMVar9 = local_60;
  if (options->verifyClients == true) {
    SSL_CTX_set_verify(local_68,3,(callback *)0x0);
  }
  TVar2 = options->minVersion;
  uVar12 = (uint)(0 < (int)TVar2) * 0x2000000;
  uVar13 = uVar12 + 0x4000000;
  if ((int)TVar2 < 2) {
    uVar13 = uVar12;
  }
  uVar12 = uVar13 + 0x10000000;
  if ((int)TVar2 < 3) {
    uVar12 = uVar13;
  }
  uVar13 = uVar12 | 0x8000000;
  if ((int)TVar2 < 4) {
    uVar13 = uVar12;
  }
  uVar12 = uVar13 | 0x20000000;
  if ((int)TVar2 < 5) {
    uVar12 = uVar13;
  }
  SSL_CTX_set_options(local_68,uVar12);
  iVar10 = SSL_CTX_set_cipher_list(local_68,(options->cipherList).content.ptr);
  if (iVar10 == 0) {
    anon_unknown_312::throwOpensslError();
  }
  if ((options->curveList).ptr.isSet == true) {
    lVar14 = SSL_CTX_ctrl(local_68,0x5c,0,(options->curveList).ptr.field_1.value.content.ptr);
    if (lVar14 == 0) {
      anon_unknown_312::throwOpensslError();
    }
  }
  pTVar5 = (options->defaultKeypair).ptr;
  if (pTVar5 != (TlsKeypair *)0x0) {
    iVar10 = SSL_CTX_use_PrivateKey(local_68,(EVP_PKEY *)(pTVar5->privateKey).pkey);
    if (iVar10 != 0) {
      iVar10 = SSL_CTX_use_certificate(local_68,(X509 *)(pTVar5->certificate).chain[0]);
      if (iVar10 != 0) {
        lVar14 = 2;
        do {
          parg = (pTVar5->certificate).chain[lVar14 + -1];
          if (parg == (void *)0x0) break;
          lVar11 = SSL_CTX_ctrl(local_68,0xe,0,parg);
          if (lVar11 == 0) {
            anon_unknown_312::throwOpensslError();
          }
          X509_up_ref(parg);
          lVar14 = lVar14 + 1;
        } while (lVar14 != 0xb);
        goto LAB_00493d4e;
      }
    }
    anon_unknown_312::throwOpensslError();
  }
LAB_00493d4e:
  parg_00 = (options->sniCallback).ptr;
  if (parg_00 != (TlsSniCallback *)0x0) {
    SSL_CTX_callback_ctrl(local_68,0x35,SniCallback::callback);
    SSL_CTX_ctrl(local_68,0x36,0,parg_00);
  }
  if ((options->acceptTimeout).ptr.isSet == true) {
    pTVar6 = (options->timer).ptr;
    if (pTVar6 == (Timer *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[60]>
                (&local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++"
                 ,0x365,FAILED,"options.timer != nullptr",
                 "\"acceptTimeout option requires that a timer is also provided\"",
                 (char (*) [60])"acceptTimeout option requires that a timer is also provided");
      kj::_::Debug::Fault::fatal(&local_58);
    }
    (this->timer).ptr = pTVar6;
    if ((this->acceptTimeout).ptr.isSet == true) {
      (this->acceptTimeout).ptr.isSet = false;
    }
    (this->acceptTimeout).ptr.field_1 = (options->acceptTimeout).ptr.field_1;
    (this->acceptTimeout).ptr.isSet = true;
  }
  pMVar1 = &options->acceptErrorHandler;
  if (pMVar1 != pMVar9) {
    if ((pMVar9->ptr).isSet == true) {
      (this->acceptErrorHandler).ptr.isSet = false;
      pIVar7 = (this->acceptErrorHandler).ptr.field_1.value.impl.ptr;
      if (pIVar7 != (Iface *)0x0) {
        (this->acceptErrorHandler).ptr.field_1.value.impl.ptr = (Iface *)0x0;
        pDVar8 = (this->acceptErrorHandler).ptr.field_1.value.impl.disposer;
        (**pDVar8->_vptr_Disposer)(pDVar8,pIVar7->_vptr_Iface[-2] + (long)&pIVar7->_vptr_Iface);
      }
    }
    if ((pMVar1->ptr).isSet == true) {
      (this->acceptErrorHandler).ptr.field_1.value.impl.disposer =
           (options->acceptErrorHandler).ptr.field_1.value.impl.disposer;
      (this->acceptErrorHandler).ptr.field_1.value.impl.ptr =
           (options->acceptErrorHandler).ptr.field_1.value.impl.ptr;
      (options->acceptErrorHandler).ptr.field_1.value.impl.ptr = (Iface *)0x0;
      (this->acceptErrorHandler).ptr.isSet = true;
    }
  }
  if ((pMVar1->ptr).isSet == true) {
    (options->acceptErrorHandler).ptr.isSet = false;
    pIVar7 = (options->acceptErrorHandler).ptr.field_1.value.impl.ptr;
    if (pIVar7 != (Iface *)0x0) {
      (options->acceptErrorHandler).ptr.field_1.value.impl.ptr = (Iface *)0x0;
      pDVar8 = (options->acceptErrorHandler).ptr.field_1.value.impl.disposer;
      (**pDVar8->_vptr_Disposer)(pDVar8,pIVar7->_vptr_Iface[-2] + (long)&pIVar7->_vptr_Iface);
    }
  }
  this->ctx = local_68;
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++:775:3)>
  ::~Deferred(&local_48);
  return;
}

Assistant:

TlsContext::TlsContext(Options options) {
  ensureOpenSslInitialized();

#if OPENSSL_VERSION_NUMBER >= 0x10100000L || defined(OPENSSL_IS_BORINGSSL)
  SSL_CTX* ctx = SSL_CTX_new(TLS_method());
#else
  SSL_CTX* ctx = SSL_CTX_new(SSLv23_method());
#endif

  if (ctx == nullptr) {
    throwOpensslError();
  }
  KJ_ON_SCOPE_FAILURE(SSL_CTX_free(ctx));

  // honor options.useSystemTrustStore
  if (options.useSystemTrustStore) {
    if (!SSL_CTX_set_default_verify_paths(ctx)) {
      throwOpensslError();
    }
#ifdef _WIN32
    updateOpenSSLCAStoreWithWindowsCertificates(ctx);
#endif
  }

  // honor options.trustedCertificates
  if (options.trustedCertificates.size() > 0) {
    X509_STORE* store = SSL_CTX_get_cert_store(ctx);
    if (store == nullptr) {
      throwOpensslError();
    }
    for (auto& cert: options.trustedCertificates) {
      if (!X509_STORE_add_cert(store, reinterpret_cast<X509*>(cert.chain[0]))) {
        throwOpensslError();
      }
    }
  }

  if (options.verifyClients) {
    SSL_CTX_set_verify(ctx, SSL_VERIFY_PEER | SSL_VERIFY_FAIL_IF_NO_PEER_CERT, NULL);
  }

  // honor options.minVersion
  long optionFlags = 0;
  if (options.minVersion > TlsVersion::SSL_3) {
    optionFlags |= SSL_OP_NO_SSLv3;
  }
  if (options.minVersion > TlsVersion::TLS_1_0) {
    optionFlags |= SSL_OP_NO_TLSv1;
  }
  if (options.minVersion > TlsVersion::TLS_1_1) {
    optionFlags |= SSL_OP_NO_TLSv1_1;
  }
  if (options.minVersion > TlsVersion::TLS_1_2) {
    optionFlags |= SSL_OP_NO_TLSv1_2;
  }
  if (options.minVersion > TlsVersion::TLS_1_3) {
#ifdef SSL_OP_NO_TLSv1_3
    optionFlags |= SSL_OP_NO_TLSv1_3;
#else
    KJ_FAIL_REQUIRE("OpenSSL headers don't support TLS 1.3");
#endif
  }
  SSL_CTX_set_options(ctx, optionFlags);  // note: never fails; returns new options bitmask

  // honor options.cipherList
  if (!SSL_CTX_set_cipher_list(ctx, options.cipherList.cStr())) {
    throwOpensslError();
  }

  KJ_IF_SOME(curves, options.curveList) {
    if (!SSL_CTX_set1_curves_list(ctx, curves.cStr())){
      throwOpensslError();
    }
  }

  // honor options.defaultKeypair
  KJ_IF_SOME(kp, options.defaultKeypair) {
    if (!SSL_CTX_use_PrivateKey(ctx, reinterpret_cast<EVP_PKEY*>(kp.privateKey.pkey))) {
      throwOpensslError();
    }

    if (!SSL_CTX_use_certificate(ctx, reinterpret_cast<X509*>(kp.certificate.chain[0]))) {
      throwOpensslError();
    }

    for (size_t i = 1; i < kj::size(kp.certificate.chain); i++) {
      X509* x509 = reinterpret_cast<X509*>(kp.certificate.chain[i]);
      if (x509 == nullptr) break;  // end of chain

      if (!SSL_CTX_add_extra_chain_cert(ctx, x509)) {
        throwOpensslError();
      }

      // SSL_CTX_add_extra_chain_cert() does NOT up the refcount itself.
      X509_up_ref(x509);
    }
  }

  // honor options.sniCallback
  KJ_IF_SOME(sni, options.sniCallback) {
    SSL_CTX_set_tlsext_servername_callback(ctx, &SniCallback::callback);
    SSL_CTX_set_tlsext_servername_arg(ctx, &sni);
  }

  KJ_IF_SOME(timeout, options.acceptTimeout) {
    this->timer = KJ_REQUIRE_NONNULL(options.timer,
        "acceptTimeout option requires that a timer is also provided");
    this->acceptTimeout = timeout;
  }

  this->acceptErrorHandler = kj::mv(options.acceptErrorHandler);

  this->ctx = ctx;
}